

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[3],kj::StringTree,char_const(&)[12],kj::StringTree,char_const(&)[11],kj::StringTree,char_const(&)[24],kj::StringTree,char_const(&)[27]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],StringTree *params_1,
          char (*params_2) [12],StringTree *params_3,char (*params_4) [11],StringTree *params_5,
          char (*params_6) [24],StringTree *params_7,char (*params_8) [27])

{
  char (*value) [3];
  StringTree *pSVar1;
  char (*value_00) [12];
  StringTree *pSVar2;
  char (*value_01) [11];
  StringTree *pSVar3;
  char (*value_02) [24];
  StringTree *pSVar4;
  char (*value_03) [27];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  Branch *local_40;
  char (*params_local_4) [11];
  StringTree *params_local_3;
  char (*params_local_2) [12];
  StringTree *params_local_1;
  char (*params_local) [3];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_40 = (Branch *)params_3;
  params_local_4 = (char (*) [11])params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [12])params;
  params_local_1 = (StringTree *)this;
  params_local = (char (*) [3])__return_storage_ptr__;
  value = ::const((char (*) [3])this);
  local_50 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value_00 = ::const((char (*) [12])params_local_3);
  local_60 = _::toStringTreeOrCharSequence<char_const(&)[12]>(value_00);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  pSVar2 = _::toStringTreeOrCharSequence(pSVar2);
  value_01 = ::const((char (*) [11])local_40);
  local_70 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value_01);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_4);
  pSVar3 = _::toStringTreeOrCharSequence(pSVar3);
  value_02 = ::const((char (*) [24])params_5);
  local_80 = _::toStringTreeOrCharSequence<char_const(&)[24]>(value_02);
  pSVar4 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_6);
  pSVar4 = _::toStringTreeOrCharSequence(pSVar4);
  value_03 = ::const((char (*) [27])params_7);
  local_90 = _::toStringTreeOrCharSequence<char_const(&)[27]>(value_03);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,(StringTree *)&local_50,(ArrayPtr<const_char> *)pSVar1,
             (StringTree *)&local_60,(ArrayPtr<const_char> *)pSVar2,(StringTree *)&local_70,
             (ArrayPtr<const_char> *)pSVar3,(StringTree *)&local_80,(ArrayPtr<const_char> *)pSVar4,
             (StringTree *)&local_90,(ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}